

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

void QCommandLineParser::showMessageAndExit(MessageType type,QString *message,int exitCode)

{
  char *__s;
  int in_EDX;
  QString *in_RSI;
  int in_EDI;
  undefined8 local_58;
  QString *in_stack_ffffffffffffffb8;
  
  QtPrivate::asString(in_RSI);
  QString::toLocal8Bit(in_stack_ffffffffffffffb8);
  __s = QByteArray::constData((QByteArray *)0x6f1404);
  if (in_EDI == 0) {
    local_58 = _stdout;
  }
  else {
    local_58 = _stderr;
  }
  fputs(__s,local_58);
  QByteArray::~QByteArray((QByteArray *)0x6f144b);
  qt_call_post_routines();
  exit(in_EDX);
}

Assistant:

[[noreturn]] void QCommandLineParser::showMessageAndExit(MessageType type, const QString &message, int exitCode)
{
#if defined(Q_OS_WIN) && !defined(QT_BOOTSTRAPPED)
    if (displayMessageBox()) {
        const UINT flags = MB_OK | MB_TOPMOST | MB_SETFOREGROUND
            | (type == MessageType::Information ? MB_ICONINFORMATION : MB_ICONERROR);
        QString title;
        if (QCoreApplication::instance())
            title = QCoreApplication::instance()->property("applicationDisplayName").toString();
        if (title.isEmpty())
            title = QCoreApplication::applicationName();
        MessageBoxW(0, reinterpret_cast<const wchar_t *>(message.utf16()),
                    reinterpret_cast<const wchar_t *>(title.utf16()), flags);
        qt_call_post_routines();
        ::exit(exitCode);
    }
#endif // Q_OS_WIN && !QT_BOOTSTRAPPED
    fputs(qPrintable(message), type == MessageType::Information ? stdout : stderr);
    qt_call_post_routines();
    ::exit(exitCode);
}